

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv2d.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  size_t in_stack_000000b0;
  size_t in_stack_000000b8;
  size_t in_stack_000000c0;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"performance float");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  benchmark<float>(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0);
  poVar1 = std::operator<<((ostream *)&std::cout,"performance double");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  benchmark<double>(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
	std::cout<<"performance float"<<std::endl;
	benchmark<float>(8,32,16);
	std::cout<<"performance double"<<std::endl;
	benchmark<double>(8,32,16);
}